

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeInternalForcesContIntNoDamping
          (ChElementBeamANCF_3333 *this,ChVectorDynamic<> *Fi)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  void *pvVar56;
  undefined8 *puVar57;
  double *pdVar58;
  char *pcVar59;
  Index index;
  ulong uVar60;
  long lVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  undefined1 auVar79 [32];
  double dVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  ChMatrixNMc<double,_3_*_NIP,_3> FC;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  MatrixNx3 QiCompact;
  Matrix3xN e_bar;
  double local_e28;
  Scalar local_e00;
  undefined1 local_df8 [32];
  undefined1 local_dd8 [32];
  undefined1 local_db8 [32];
  undefined1 local_d98 [16];
  double dStack_d88;
  double dStack_d80;
  undefined1 local_d78 [32];
  undefined1 local_d58 [32];
  undefined1 local_d38 [32];
  undefined1 local_d18 [32];
  undefined1 local_cf8 [32];
  undefined1 local_cd8 [32];
  undefined1 local_cb8 [32];
  undefined1 local_c98 [32];
  undefined1 local_c78 [32];
  undefined1 local_c58 [32];
  undefined1 local_c38 [32];
  undefined1 local_c18 [32];
  double local_bf8;
  double dStack_bf0;
  double dStack_be8;
  double dStack_be0;
  double local_bd8;
  double dStack_bd0;
  double dStack_bc8;
  double dStack_bc0;
  double local_bb8;
  double dStack_bb0;
  double dStack_ba8;
  double dStack_ba0;
  double local_b98;
  double dStack_b90;
  double dStack_b88;
  double dStack_b80;
  double local_b78;
  double dStack_b70;
  double dStack_b68;
  double dStack_b60;
  double local_b58;
  double dStack_b50;
  double dStack_b48;
  double dStack_b40;
  double local_b38;
  double dStack_b30;
  double dStack_b28;
  double dStack_b20;
  double local_b18;
  double dStack_b10;
  double dStack_b08;
  double dStack_b00;
  double local_af8;
  double dStack_af0;
  double dStack_ae8;
  double dStack_ae0;
  double local_ad8;
  double dStack_ad0;
  double dStack_ac8;
  double dStack_ac0;
  double local_ab8;
  double dStack_ab0;
  double dStack_aa8;
  double dStack_aa0;
  double local_a98;
  double dStack_a90;
  double dStack_a88;
  double dStack_a80;
  double local_a78;
  double dStack_a70;
  double dStack_a68;
  double dStack_a60;
  undefined1 local_a58 [96];
  undefined1 local_9f8 [32];
  undefined1 local_9d8 [32];
  undefined1 local_9b8 [32];
  undefined1 local_998 [32];
  undefined1 local_978 [32];
  undefined1 local_958 [32];
  double local_938;
  double dStack_930;
  double local_928;
  double local_920;
  double dStack_918;
  double local_910;
  double local_908;
  double dStack_900;
  double local_8f8;
  double local_8f0;
  double dStack_8e8;
  double dStack_8e0;
  double dStack_8d8;
  undefined1 local_8d0 [32];
  undefined1 local_8b0 [32];
  undefined1 local_890 [32];
  undefined1 local_870 [32];
  undefined1 local_850 [32];
  undefined1 local_830 [32];
  undefined1 local_810 [32];
  undefined1 local_7f0 [32];
  double local_7d0;
  double dStack_7c8;
  double local_7c0;
  double local_7b8;
  double dStack_7b0;
  double local_7a8;
  double local_7a0;
  double dStack_798;
  double local_790;
  undefined1 local_788 [32];
  double local_768;
  double dStack_760;
  double dStack_758;
  double dStack_750;
  double local_748;
  double dStack_740;
  double dStack_738;
  double dStack_730;
  undefined1 local_728 [32];
  undefined1 local_708 [32];
  undefined1 local_6e8 [32];
  undefined1 local_6c8 [32];
  undefined1 local_6a8 [32];
  undefined1 local_688 [32];
  double local_668;
  double dStack_660;
  double local_658;
  double local_650;
  double dStack_648;
  double local_640;
  double local_638;
  double dStack_630;
  double local_628;
  undefined1 local_620 [64];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  double local_560;
  double dStack_558;
  double dStack_550;
  double dStack_548;
  double local_540;
  double dStack_538;
  double dStack_530;
  double dStack_528;
  double local_520;
  double dStack_518;
  double dStack_510;
  double dStack_508;
  double local_500;
  double dStack_4f8;
  double local_4f0;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  double local_4d0;
  double dStack_4c8;
  double local_4c0;
  undefined1 local_4b8 [32];
  undefined1 local_498 [32];
  undefined1 local_478 [32];
  undefined1 local_458 [32];
  undefined1 local_438 [32];
  undefined1 local_418 [32];
  double local_3f8;
  double dStack_3f0;
  double dStack_3e8;
  double dStack_3e0;
  double local_3d8;
  double dStack_3d0;
  double dStack_3c8;
  double dStack_3c0;
  double local_3b8;
  double dStack_3b0;
  double dStack_3a8;
  double dStack_3a0;
  double local_398;
  double dStack_390;
  double local_388;
  double local_380;
  double dStack_378;
  double local_370;
  double local_368;
  double dStack_360;
  double local_358;
  undefined1 local_350 [32];
  undefined1 local_330 [32];
  undefined1 local_310 [32];
  double local_2f0;
  double dStack_2e8;
  double dStack_2e0;
  double dStack_2d8;
  double local_2d0;
  double dStack_2c8;
  double dStack_2c0;
  double dStack_2b8;
  double local_2b0;
  double dStack_2a8;
  double dStack_2a0;
  double dStack_298;
  double local_290;
  double dStack_288;
  double dStack_280;
  double dStack_278;
  double local_270;
  double dStack_268;
  double dStack_260;
  double dStack_258;
  double local_250;
  double dStack_248;
  double dStack_240;
  double dStack_238;
  double local_230;
  double dStack_228;
  double local_220;
  double local_218;
  double dStack_210;
  double local_208;
  double local_200;
  double dStack_1f8;
  double local_1f0;
  Matrix<double,_9,_3,_1,_9,_3> local_1e8;
  Matrix3xN local_108;
  
  CalcCoordMatrix(this,&local_108);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 9) {
    pcVar59 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, 3, 9, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Transpose<Eigen::Matrix<double, 3, 9, 1>>, Option = 0]"
    ;
LAB_00738e2e:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar59);
  }
  local_620._8_8_ = &local_108;
  local_620._0_8_ = &this->m_SD;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      != 0x2d) {
    pcVar59 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 45, 3, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 45, 3, 0>]"
    ;
LAB_00738e50:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar59);
  }
  memset((Matrix<double,_45,_3,_0,_45,_3> *)local_a58,0,0x438);
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.array[0] =
       1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,3,9,1,3,9>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,45,3,0,45,3>>
            ((Matrix<double,_45,_3,_0,_45,_3> *)local_a58,
             (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_620,
             (Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_> *)(local_620 + 8),
             (Scalar *)&local_1e8);
  peVar5 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  uVar60 = (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
  uVar7 = (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols;
  if (-1 < (long)(uVar7 | uVar60)) {
    if ((uVar60 == 0xc) && (uVar7 == 1)) {
      local_b78 = (double)local_a58._0_8_;
      dStack_b70 = (double)local_a58._8_8_;
      dStack_b68 = (double)local_a58._16_8_;
      dStack_b60 = (double)local_a58._24_8_;
      local_b98 = (double)local_a58._32_8_;
      dStack_b90 = (double)local_a58._40_8_;
      dStack_b88 = (double)local_a58._48_8_;
      dStack_b80 = (double)local_a58._56_8_;
      dVar10 = local_8d0._0_8_;
      dVar14 = local_8d0._8_8_;
      dVar25 = local_8d0._16_8_;
      dVar36 = local_8d0._24_8_;
      auVar63 = vmulpd_avx512vl(local_a58._64_32_,local_a58._64_32_);
      auVar64 = vmulpd_avx512vl(local_8b0,local_8b0);
      dVar47 = (peVar5->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
               .m_data.array[0] * 0.5;
      pauVar8 = (undefined1 (*) [32])
                (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      auVar82._8_8_ = dVar47;
      auVar82._0_8_ = dVar47;
      auVar82._16_8_ = dVar47;
      auVar82._24_8_ = dVar47;
      auVar71 = *pauVar8;
      auVar72 = pauVar8[1];
      auVar73 = pauVar8[2];
      dVar102 = auVar71._0_8_;
      dVar103 = auVar71._8_8_;
      dVar104 = auVar71._16_8_;
      dVar105 = auVar71._24_8_;
      local_b58 = ((double)local_a58._0_8_ * (double)local_a58._0_8_ + local_8f0 * local_8f0 +
                   local_788._0_8_ * local_788._0_8_ + -1.0) * dVar102 * dVar47;
      dStack_b50 = ((double)local_a58._8_8_ * (double)local_a58._8_8_ + dStack_8e8 * dStack_8e8 +
                    local_788._8_8_ * local_788._8_8_ + -1.0) * dVar103 * dVar47;
      dStack_b48 = ((double)local_a58._16_8_ * (double)local_a58._16_8_ + dStack_8e0 * dStack_8e0 +
                    local_788._16_8_ * local_788._16_8_ + -1.0) * dVar104 * dVar47;
      dStack_b40 = ((double)local_a58._24_8_ * (double)local_a58._24_8_ + dStack_8d8 * dStack_8d8 +
                    local_788._24_8_ * local_788._24_8_ + -1.0) * dVar105 * dVar47;
      auVar65 = vmulpd_avx512vl(auVar82,auVar72);
      local_b38 = ((double)local_a58._32_8_ * (double)local_a58._32_8_ + dVar10 * dVar10 +
                   local_768 * local_768 + -1.0) * auVar65._0_8_;
      dStack_b30 = ((double)local_a58._40_8_ * (double)local_a58._40_8_ + dVar14 * dVar14 +
                    dStack_760 * dStack_760 + -1.0) * auVar65._8_8_;
      dStack_b28 = ((double)local_a58._48_8_ * (double)local_a58._48_8_ + dVar25 * dVar25 +
                    dStack_758 * dStack_758 + -1.0) * auVar65._16_8_;
      dStack_b20 = ((double)local_a58._56_8_ * (double)local_a58._56_8_ + dVar36 * dVar36 +
                    dStack_750 * dStack_750 + -1.0) * auVar65._24_8_;
      auVar65 = vmulpd_avx512vl(auVar82,auVar73);
      local_b18 = (auVar63._0_8_ + auVar64._0_8_ + local_748 * local_748 + -1.0) * auVar65._0_8_;
      dStack_b10 = (auVar63._8_8_ + auVar64._8_8_ + dStack_740 * dStack_740 + -1.0) * auVar65._8_8_;
      dStack_b08 = (auVar63._16_8_ + auVar64._16_8_ + dStack_738 * dStack_738 + -1.0) *
                   auVar65._16_8_;
      dStack_b00 = (auVar63._24_8_ + auVar64._24_8_ + dStack_730 * dStack_730 + -1.0) *
                   auVar65._24_8_;
      dVar96 = local_9f8._0_8_;
      dVar15 = local_9f8._8_8_;
      dVar26 = local_9f8._16_8_;
      dVar37 = local_9f8._24_8_;
      dVar97 = local_890._0_8_;
      dVar16 = local_890._8_8_;
      dVar27 = local_890._16_8_;
      dVar38 = local_890._24_8_;
      dVar11 = local_9d8._0_8_;
      dVar17 = local_9d8._8_8_;
      dVar28 = local_9d8._16_8_;
      dVar39 = local_9d8._24_8_;
      dVar12 = local_708._0_8_;
      dVar18 = local_708._8_8_;
      dVar29 = local_708._16_8_;
      dVar40 = local_708._24_8_;
      auVar63 = vmulpd_avx512vl(local_9b8,local_9b8);
      dVar98 = local_6e8._0_8_;
      dVar19 = local_6e8._8_8_;
      dVar30 = local_6e8._16_8_;
      dVar41 = local_6e8._24_8_;
      dVar47 = *(double *)
                ((long)(peVar5->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array + 8) * 0.5;
      auVar85._8_8_ = dVar47;
      auVar85._0_8_ = dVar47;
      auVar85._16_8_ = dVar47;
      auVar85._24_8_ = dVar47;
      local_af8 = dVar102 * dVar47 *
                  (dVar96 * dVar96 + dVar97 * dVar97 + local_728._0_8_ * local_728._0_8_ + -1.0);
      dStack_af0 = dVar103 * dVar47 *
                   (dVar15 * dVar15 + dVar16 * dVar16 + local_728._8_8_ * local_728._8_8_ + -1.0);
      dStack_ae8 = dVar104 * dVar47 *
                   (dVar26 * dVar26 + dVar27 * dVar27 + local_728._16_8_ * local_728._16_8_ + -1.0);
      dStack_ae0 = dVar105 * dVar47 *
                   (dVar37 * dVar37 + dVar38 * dVar38 + local_728._24_8_ * local_728._24_8_ + -1.0);
      auVar64 = vmulpd_avx512vl(auVar72,auVar85);
      local_ad8 = (dVar11 * dVar11 + local_870._0_8_ * local_870._0_8_ + dVar12 * dVar12 + -1.0) *
                  auVar64._0_8_;
      dStack_ad0 = (dVar17 * dVar17 + local_870._8_8_ * local_870._8_8_ + dVar18 * dVar18 + -1.0) *
                   auVar64._8_8_;
      dStack_ac8 = (dVar28 * dVar28 + local_870._16_8_ * local_870._16_8_ + dVar29 * dVar29 + -1.0)
                   * auVar64._16_8_;
      dStack_ac0 = (dVar39 * dVar39 + local_870._24_8_ * local_870._24_8_ + dVar40 * dVar40 + -1.0)
                   * auVar64._24_8_;
      auVar64 = vmulpd_avx512vl(auVar73,auVar85);
      local_ab8 = (auVar63._0_8_ + local_850._0_8_ * local_850._0_8_ + dVar98 * dVar98 + -1.0) *
                  auVar64._0_8_;
      dStack_ab0 = (auVar63._8_8_ + local_850._8_8_ * local_850._8_8_ + dVar19 * dVar19 + -1.0) *
                   auVar64._8_8_;
      dStack_aa8 = (auVar63._16_8_ + local_850._16_8_ * local_850._16_8_ + dVar30 * dVar30 + -1.0) *
                   auVar64._16_8_;
      dStack_aa0 = (auVar63._24_8_ + local_850._24_8_ * local_850._24_8_ + dVar41 * dVar41 + -1.0) *
                   auVar64._24_8_;
      auVar63 = vmulpd_avx512vl(local_998,local_998);
      dVar99 = local_830._0_8_;
      dVar20 = local_830._8_8_;
      dVar31 = local_830._16_8_;
      dVar42 = local_830._24_8_;
      dVar100 = local_978._0_8_;
      dVar21 = local_978._8_8_;
      dVar32 = local_978._16_8_;
      dVar43 = local_978._24_8_;
      dVar101 = local_810._0_8_;
      dVar22 = local_810._8_8_;
      dVar33 = local_810._16_8_;
      dVar44 = local_810._24_8_;
      dVar80 = local_6a8._0_8_;
      dVar23 = local_6a8._8_8_;
      dVar34 = local_6a8._16_8_;
      dVar45 = local_6a8._24_8_;
      dVar13 = local_958._0_8_;
      dVar24 = local_958._8_8_;
      dVar35 = local_958._16_8_;
      dVar46 = local_958._24_8_;
      dVar47 = *(double *)
                ((long)(peVar5->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array + 0x10) * 0.5;
      auVar83._8_8_ = dVar47;
      auVar83._0_8_ = dVar47;
      auVar83._16_8_ = dVar47;
      auVar83._24_8_ = dVar47;
      local_a98 = (auVar63._0_8_ + dVar99 * dVar99 + local_6c8._0_8_ * local_6c8._0_8_ + -1.0) *
                  dVar102 * dVar47;
      dStack_a90 = (auVar63._8_8_ + dVar20 * dVar20 + local_6c8._8_8_ * local_6c8._8_8_ + -1.0) *
                   dVar103 * dVar47;
      dStack_a88 = (auVar63._16_8_ + dVar31 * dVar31 + local_6c8._16_8_ * local_6c8._16_8_ + -1.0) *
                   dVar104 * dVar47;
      dStack_a80 = (auVar63._24_8_ + dVar42 * dVar42 + local_6c8._24_8_ * local_6c8._24_8_ + -1.0) *
                   dVar105 * dVar47;
      auVar63 = vmulpd_avx512vl(auVar72,auVar83);
      local_a78 = (dVar100 * dVar100 + dVar101 * dVar101 + dVar80 * dVar80 + -1.0) * auVar63._0_8_;
      dStack_a70 = (dVar21 * dVar21 + dVar22 * dVar22 + dVar23 * dVar23 + -1.0) * auVar63._8_8_;
      dStack_a68 = (dVar32 * dVar32 + dVar33 * dVar33 + dVar34 * dVar34 + -1.0) * auVar63._16_8_;
      dStack_a60 = (dVar43 * dVar43 + dVar44 * dVar44 + dVar45 * dVar45 + -1.0) * auVar63._24_8_;
      auVar63 = vmulpd_avx512vl(auVar73,auVar83);
      dVar75 = (dVar13 * dVar13 + local_7f0._0_8_ * local_7f0._0_8_ +
                local_688._0_8_ * local_688._0_8_ + -1.0) * auVar63._0_8_;
      dVar76 = (dVar24 * dVar24 + local_7f0._8_8_ * local_7f0._8_8_ +
                local_688._8_8_ * local_688._8_8_ + -1.0) * auVar63._8_8_;
      dVar77 = (dVar35 * dVar35 + local_7f0._16_8_ * local_7f0._16_8_ +
                local_688._16_8_ * local_688._16_8_ + -1.0) * auVar63._16_8_;
      dVar78 = (dVar46 * dVar46 + local_7f0._24_8_ * local_7f0._24_8_ +
                local_688._24_8_ * local_688._24_8_ + -1.0) * auVar63._24_8_;
      auVar63 = vmulpd_avx512vl(local_9f8,local_998);
      auVar64 = vmulpd_avx512vl(local_890,local_830);
      local_c38 = local_6c8;
      local_d18 = local_728;
      auVar65 = vmulpd_avx512vl(local_728,local_6c8);
      auVar66 = vmulpd_avx512vl(local_9d8,local_978);
      auVar67 = vmulpd_avx512vl(local_870,local_810);
      local_c18 = local_6a8;
      local_cf8 = local_708;
      auVar68 = vmulpd_avx512vl(local_9b8,local_958);
      auVar69 = vmulpd_avx512vl(local_850,local_7f0);
      local_c78 = local_7f0;
      dVar47 = *(double *)
                ((long)(peVar5->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array + 0x18);
      auVar86._8_8_ = dVar47;
      auVar86._0_8_ = dVar47;
      auVar86._16_8_ = dVar47;
      auVar86._24_8_ = dVar47;
      auVar70 = vmulpd_avx512vl(local_6e8,local_688);
      local_c58 = local_688;
      local_d38 = local_6e8;
      local_bf8 = (auVar63._0_8_ + auVar64._0_8_ + auVar65._0_8_) * dVar102 * dVar47;
      dStack_bf0 = (auVar63._8_8_ + auVar64._8_8_ + auVar65._8_8_) * dVar103 * dVar47;
      dStack_be8 = (auVar63._16_8_ + auVar64._16_8_ + auVar65._16_8_) * dVar104 * dVar47;
      dStack_be0 = (auVar63._24_8_ + auVar64._24_8_ + auVar65._24_8_) * dVar105 * dVar47;
      auVar63 = vmulpd_avx512vl(auVar72,auVar86);
      local_bd8 = (auVar66._0_8_ + auVar67._0_8_ + dVar80 * dVar12) * auVar63._0_8_;
      dStack_bd0 = (auVar66._8_8_ + auVar67._8_8_ + dVar23 * dVar18) * auVar63._8_8_;
      dStack_bc8 = (auVar66._16_8_ + auVar67._16_8_ + dVar34 * dVar29) * auVar63._16_8_;
      dStack_bc0 = (auVar66._24_8_ + auVar67._24_8_ + dVar45 * dVar40) * auVar63._24_8_;
      auVar63 = vmulpd_avx512vl(auVar73,auVar86);
      local_bb8 = (auVar68._0_8_ + auVar69._0_8_ + auVar70._0_8_) * auVar63._0_8_;
      dStack_bb0 = (auVar68._8_8_ + auVar69._8_8_ + auVar70._8_8_) * auVar63._8_8_;
      dStack_ba8 = (auVar68._16_8_ + auVar69._16_8_ + auVar70._16_8_) * auVar63._16_8_;
      dStack_ba0 = (auVar68._24_8_ + auVar69._24_8_ + auVar70._24_8_) * auVar63._24_8_;
      auVar49._8_8_ = local_a58._8_8_;
      auVar49._0_8_ = local_a58._0_8_;
      auVar49._16_8_ = local_a58._16_8_;
      auVar49._24_8_ = local_a58._24_8_;
      auVar63._8_8_ = dStack_8e8;
      auVar63._0_8_ = local_8f0;
      auVar63._16_8_ = dStack_8e0;
      auVar63._24_8_ = dStack_8d8;
      local_d58 = local_788;
      auVar64 = vmulpd_avx512vl(local_788,local_6c8);
      auVar84._0_8_ = (double)local_a58._0_8_ * local_998._0_8_ + local_8f0 * dVar99 + auVar64._0_8_
      ;
      auVar84._8_8_ =
           (double)local_a58._8_8_ * local_998._8_8_ + dStack_8e8 * dVar20 + auVar64._8_8_;
      auVar84._16_8_ =
           (double)local_a58._16_8_ * local_998._16_8_ + dStack_8e0 * dVar31 + auVar64._16_8_;
      auVar84._24_8_ =
           (double)local_a58._24_8_ * local_998._24_8_ + dStack_8d8 * dVar42 + auVar64._24_8_;
      auVar70._8_8_ = local_a58._40_8_;
      auVar70._0_8_ = local_a58._32_8_;
      auVar70._16_8_ = local_a58._48_8_;
      auVar70._24_8_ = local_a58._56_8_;
      auVar65 = vmulpd_avx512vl(auVar70,local_978);
      auVar66 = vmulpd_avx512vl(local_8d0,local_810);
      auVar64._8_8_ = dStack_760;
      auVar64._0_8_ = local_768;
      auVar64._16_8_ = dStack_758;
      auVar64._24_8_ = dStack_750;
      auVar67 = vmulpd_avx512vl(auVar64,local_6a8);
      auVar81._0_8_ = auVar65._0_8_ + auVar66._0_8_ + auVar67._0_8_;
      auVar81._8_8_ = auVar65._8_8_ + auVar66._8_8_ + auVar67._8_8_;
      auVar81._16_8_ = auVar65._16_8_ + auVar66._16_8_ + auVar67._16_8_;
      auVar81._24_8_ = auVar65._24_8_ + auVar66._24_8_ + auVar67._24_8_;
      auVar65 = vmulpd_avx512vl(local_a58._64_32_,local_958);
      auVar66 = vmulpd_avx512vl(local_8b0,local_7f0);
      auVar66 = vaddpd_avx512vl(auVar65,auVar66);
      auVar62._8_8_ = 0;
      auVar62._0_8_ =
           *(double *)
            ((long)(peVar5->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array + 0x20);
      auVar67 = vbroadcastsd_avx512vl(auVar62);
      auVar65._8_8_ = dStack_740;
      auVar65._0_8_ = local_748;
      auVar65._16_8_ = dStack_738;
      auVar65._24_8_ = dStack_730;
      auVar65 = vmulpd_avx512vl(auVar65,local_688);
      auVar65 = vaddpd_avx512vl(auVar66,auVar65);
      auVar66 = vmulpd_avx512vl(auVar71,auVar67);
      local_c98 = vmulpd_avx512vl(auVar84,auVar66);
      auVar66 = vmulpd_avx512vl(auVar72,auVar67);
      local_cd8 = vmulpd_avx512vl(auVar81,auVar66);
      auVar66 = vmulpd_avx512vl(auVar73,auVar67);
      local_cb8 = vmulpd_avx512vl(auVar65,auVar66);
      auVar65 = vmulpd_avx512vl(auVar49,local_9f8);
      auVar66 = vmulpd_avx512vl(auVar63,local_890);
      auVar65 = vaddpd_avx512vl(auVar65,auVar66);
      auVar66 = vmulpd_avx512vl(local_788,local_728);
      auVar65 = vaddpd_avx512vl(auVar65,auVar66);
      auVar66 = vmulpd_avx512vl(auVar70,local_9d8);
      auVar67 = vmulpd_avx512vl(local_8d0,local_870);
      local_df8 = local_8d0;
      auVar66 = vaddpd_avx512vl(auVar66,auVar67);
      auVar64 = vmulpd_avx512vl(auVar64,local_708);
      auVar66 = vaddpd_avx512vl(auVar66,auVar64);
      auVar67 = vmulpd_avx512vl(local_a58._64_32_,local_9b8);
      local_db8 = local_a58._64_32_;
      local_dd8 = local_850;
      auVar68 = vmulpd_avx512vl(local_8b0,local_850);
      _local_d98 = local_8b0;
      auVar64 = _local_d98;
      auVar67 = vaddpd_avx512vl(auVar67,auVar68);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(double *)
                      ((long)(peVar5->m_D0).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array + 0x28);
      auVar68 = vbroadcastsd_avx512vl(auVar4);
      auVar88._0_8_ = dVar98 * local_748;
      auVar88._8_8_ = dVar19 * dStack_740;
      auVar88._16_8_ = dVar30 * dStack_738;
      auVar88._24_8_ = dVar41 * dStack_730;
      auVar67 = vaddpd_avx512vl(auVar67,auVar88);
      auVar71 = vmulpd_avx512vl(auVar71,auVar68);
      auVar87._0_8_ = auVar65._0_8_ * auVar71._0_8_;
      auVar87._8_8_ = auVar65._8_8_ * auVar71._8_8_;
      auVar87._16_8_ = auVar65._16_8_ * auVar71._16_8_;
      auVar87._24_8_ = auVar65._24_8_ * auVar71._24_8_;
      auVar71 = vmulpd_avx512vl(auVar72,auVar68);
      auVar65 = vmulpd_avx512vl(auVar66,auVar71);
      auVar71 = vmulpd_avx512vl(auVar73,auVar68);
      auVar79._0_8_ = auVar67._0_8_ * auVar71._0_8_;
      auVar79._8_8_ = auVar67._8_8_ * auVar71._8_8_;
      auVar79._16_8_ = auVar67._16_8_ * auVar71._16_8_;
      auVar79._24_8_ = auVar67._24_8_ * auVar71._24_8_;
      auVar74._8_8_ = dStack_b50;
      auVar74._0_8_ = local_b58;
      auVar74._16_8_ = dStack_b48;
      auVar74._24_8_ = dStack_b40;
      auVar89._0_8_ = (double)local_a58._0_8_ * local_b58;
      auVar89._8_8_ = (double)local_a58._8_8_ * dStack_b50;
      auVar89._16_8_ = (double)local_a58._16_8_ * dStack_b48;
      auVar89._24_8_ = (double)local_a58._24_8_ * dStack_b40;
      auVar71 = vmulpd_avx512vl(local_9f8,auVar87);
      auVar71 = vaddpd_avx512vl(auVar89,auVar71);
      auVar72 = vmulpd_avx512vl(local_998,local_c98);
      local_620._0_32_ = vaddpd_avx512vl(auVar72,auVar71);
      auVar50._8_8_ = dStack_b30;
      auVar50._0_8_ = local_b38;
      auVar50._16_8_ = dStack_b28;
      auVar50._24_8_ = dStack_b20;
      auVar90._0_8_ = (double)local_a58._32_8_ * local_b38;
      auVar90._8_8_ = (double)local_a58._40_8_ * dStack_b30;
      auVar90._16_8_ = (double)local_a58._48_8_ * dStack_b28;
      auVar90._24_8_ = (double)local_a58._56_8_ * dStack_b20;
      auVar71 = vmulpd_avx512vl(local_9d8,auVar65);
      local_d78 = local_9d8;
      auVar71 = vaddpd_avx512vl(auVar90,auVar71);
      auVar72 = vmulpd_avx512vl(local_978,local_cd8);
      local_620._32_32_ = vaddpd_avx512vl(auVar72,auVar71);
      auVar51._8_8_ = dStack_b10;
      auVar51._0_8_ = local_b18;
      auVar51._16_8_ = dStack_b08;
      auVar51._24_8_ = dStack_b00;
      auVar91._0_8_ = local_a58._64_8_ * local_b18;
      auVar91._8_8_ = local_a58._72_8_ * dStack_b10;
      auVar91._16_8_ = local_a58._80_8_ * dStack_b08;
      auVar91._24_8_ = local_a58._88_8_ * dStack_b00;
      auVar71 = vmulpd_avx512vl(local_9b8,auVar79);
      auVar71 = vaddpd_avx512vl(auVar91,auVar71);
      auVar72 = vmulpd_avx512vl(local_958,local_cb8);
      local_5e0 = vaddpd_avx512vl(auVar72,auVar71);
      auVar71 = vmulpd_avx512vl(auVar63,auVar74);
      auVar72 = vmulpd_avx512vl(local_890,auVar87);
      auVar71 = vaddpd_avx512vl(auVar71,auVar72);
      auVar72 = vmulpd_avx512vl(local_830,local_c98);
      local_4b8 = vaddpd_avx512vl(auVar72,auVar71);
      auVar92._0_8_ = dVar10 * local_b38;
      auVar92._8_8_ = dVar14 * dStack_b30;
      auVar92._16_8_ = dVar25 * dStack_b28;
      auVar92._24_8_ = dVar36 * dStack_b20;
      auVar71 = vmulpd_avx512vl(local_870,auVar65);
      auVar71 = vaddpd_avx512vl(auVar92,auVar71);
      auVar72 = vmulpd_avx512vl(local_810,local_cd8);
      local_498 = vaddpd_avx512vl(auVar72,auVar71);
      auVar71 = vmulpd_avx512vl(local_8b0,auVar51);
      auVar72 = vmulpd_avx512vl(local_850,auVar79);
      auVar71 = vaddpd_avx512vl(auVar71,auVar72);
      auVar72 = vmulpd_avx512vl(local_7f0,local_cb8);
      local_478 = vaddpd_avx512vl(auVar72,auVar71);
      auVar71 = vmulpd_avx512vl(local_788,auVar74);
      auVar72 = vmulpd_avx512vl(local_728,auVar87);
      auVar71 = vaddpd_avx512vl(auVar71,auVar72);
      auVar72 = vmulpd_avx512vl(local_6c8,local_c98);
      local_350 = vaddpd_avx512vl(auVar72,auVar71);
      auVar72._8_8_ = dStack_760;
      auVar72._0_8_ = local_768;
      auVar72._16_8_ = dStack_758;
      auVar72._24_8_ = dStack_750;
      auVar71 = vmulpd_avx512vl(auVar72,auVar50);
      auVar73 = vmulpd_avx512vl(local_708,auVar65);
      auVar71 = vaddpd_avx512vl(auVar71,auVar73);
      auVar73 = vmulpd_avx512vl(local_6a8,local_cd8);
      local_330 = vaddpd_avx512vl(auVar73,auVar71);
      auVar73._8_8_ = dStack_740;
      auVar73._0_8_ = local_748;
      auVar73._16_8_ = dStack_738;
      auVar73._24_8_ = dStack_730;
      auVar71 = vmulpd_avx512vl(auVar73,auVar51);
      auVar63 = vmulpd_avx512vl(local_6e8,auVar79);
      auVar71 = vaddpd_avx512vl(auVar71,auVar63);
      auVar63 = vmulpd_avx512vl(local_688,local_cb8);
      local_310 = vaddpd_avx512vl(auVar63,auVar71);
      auVar93._0_8_ = (double)local_a58._0_8_ * auVar87._0_8_;
      auVar93._8_8_ = (double)local_a58._8_8_ * auVar87._8_8_;
      auVar93._16_8_ = (double)local_a58._16_8_ * auVar87._16_8_;
      auVar93._24_8_ = (double)local_a58._24_8_ * auVar87._24_8_;
      auVar52._8_8_ = dStack_af0;
      auVar52._0_8_ = local_af8;
      auVar52._16_8_ = dStack_ae8;
      auVar52._24_8_ = dStack_ae0;
      auVar71 = vmulpd_avx512vl(local_9f8,auVar52);
      auVar71 = vaddpd_avx512vl(auVar71,auVar93);
      auVar67._8_8_ = dStack_bf0;
      auVar67._0_8_ = local_bf8;
      auVar67._16_8_ = dStack_be8;
      auVar67._24_8_ = dStack_be0;
      auVar63 = vmulpd_avx512vl(local_998,auVar67);
      local_5c0 = vaddpd_avx512vl(auVar63,auVar71);
      auVar94._0_8_ = auVar65._0_8_ * (double)local_a58._32_8_;
      auVar94._8_8_ = auVar65._8_8_ * (double)local_a58._40_8_;
      auVar94._16_8_ = auVar65._16_8_ * (double)local_a58._48_8_;
      auVar94._24_8_ = auVar65._24_8_ * (double)local_a58._56_8_;
      auVar53._8_8_ = dStack_ad0;
      auVar53._0_8_ = local_ad8;
      auVar53._16_8_ = dStack_ac8;
      auVar53._24_8_ = dStack_ac0;
      auVar71 = vmulpd_avx512vl(local_9d8,auVar53);
      auVar71 = vaddpd_avx512vl(auVar71,auVar94);
      auVar68._8_8_ = dStack_bd0;
      auVar68._0_8_ = local_bd8;
      auVar68._16_8_ = dStack_bc8;
      auVar68._24_8_ = dStack_bc0;
      auVar63 = vmulpd_avx512vl(local_978,auVar68);
      local_5a0 = vaddpd_avx512vl(auVar63,auVar71);
      auVar71 = vmulpd_avx512vl(local_a58._64_32_,auVar79);
      auVar54._8_8_ = dStack_ab0;
      auVar54._0_8_ = local_ab8;
      auVar54._16_8_ = dStack_aa8;
      auVar54._24_8_ = dStack_aa0;
      auVar63 = vmulpd_avx512vl(local_9b8,auVar54);
      auVar71 = vaddpd_avx512vl(auVar63,auVar71);
      auVar69._8_8_ = dStack_bb0;
      auVar69._0_8_ = local_bb8;
      auVar69._16_8_ = dStack_ba8;
      auVar69._24_8_ = dStack_ba0;
      auVar63 = vmulpd_avx512vl(local_958,auVar69);
      local_580 = vaddpd_avx512vl(auVar63,auVar71);
      auVar71._8_8_ = dStack_8e8;
      auVar71._0_8_ = local_8f0;
      auVar71._16_8_ = dStack_8e0;
      auVar71._24_8_ = dStack_8d8;
      auVar63 = vmulpd_avx512vl(auVar71,auVar87);
      auVar66 = vmulpd_avx512vl(local_890,auVar52);
      auVar63 = vaddpd_avx512vl(auVar66,auVar63);
      auVar66 = vmulpd_avx512vl(local_830,auVar67);
      local_458 = vaddpd_avx512vl(auVar66,auVar63);
      auVar63 = vmulpd_avx512vl(local_8d0,auVar65);
      auVar66 = vmulpd_avx512vl(local_870,auVar53);
      auVar63 = vaddpd_avx512vl(auVar66,auVar63);
      auVar66 = vmulpd_avx512vl(local_810,auVar68);
      local_438 = vaddpd_avx512vl(auVar66,auVar63);
      local_d98._0_8_ = local_8b0._0_8_;
      local_d98._8_8_ = local_8b0._8_8_;
      dStack_d88 = local_8b0._16_8_;
      dStack_d80 = local_8b0._24_8_;
      auVar95._0_8_ = (double)local_d98._0_8_ * auVar79._0_8_;
      auVar95._8_8_ = (double)local_d98._8_8_ * auVar79._8_8_;
      auVar95._16_8_ = dStack_d88 * auVar79._16_8_;
      auVar95._24_8_ = dStack_d80 * auVar79._24_8_;
      auVar63 = vmulpd_avx512vl(local_850,auVar54);
      auVar63 = vaddpd_avx512vl(auVar63,auVar95);
      auVar66 = vmulpd_avx512vl(local_7f0,auVar69);
      local_418 = vaddpd_avx512vl(auVar66,auVar63);
      auVar63 = vmulpd_avx512vl(local_788,auVar87);
      auVar66 = vmulpd_avx512vl(local_728,auVar52);
      auVar74 = vmulpd_avx512vl(local_6c8,auVar67);
      local_2f0 = auVar74._0_8_ + auVar66._0_8_ + auVar63._0_8_;
      dStack_2e8 = auVar74._8_8_ + auVar66._8_8_ + auVar63._8_8_;
      dStack_2e0 = auVar74._16_8_ + auVar66._16_8_ + auVar63._16_8_;
      dStack_2d8 = auVar74._24_8_ + auVar66._24_8_ + auVar63._24_8_;
      auVar63 = vmulpd_avx512vl(auVar72,auVar65);
      auVar65 = vmulpd_avx512vl(local_6a8,auVar68);
      local_2d0 = auVar65._0_8_ + dVar12 * local_ad8 + auVar63._0_8_;
      dStack_2c8 = auVar65._8_8_ + dVar18 * dStack_ad0 + auVar63._8_8_;
      dStack_2c0 = auVar65._16_8_ + dVar29 * dStack_ac8 + auVar63._16_8_;
      dStack_2b8 = auVar65._24_8_ + dVar40 * dStack_ac0 + auVar63._24_8_;
      auVar73 = vmulpd_avx512vl(auVar73,auVar79);
      auVar63 = vmulpd_avx512vl(local_688,auVar69);
      local_2b0 = auVar63._0_8_ + dVar98 * local_ab8 + auVar73._0_8_;
      dStack_2a8 = auVar63._8_8_ + dVar19 * dStack_ab0 + auVar73._8_8_;
      dStack_2a0 = auVar63._16_8_ + dVar30 * dStack_aa8 + auVar73._16_8_;
      dStack_298 = auVar63._24_8_ + dVar41 * dStack_aa0 + auVar73._24_8_;
      auVar73 = vmulpd_avx512vl(auVar49,local_c98);
      auVar55._8_8_ = dStack_a90;
      auVar55._0_8_ = local_a98;
      auVar55._16_8_ = dStack_a88;
      auVar55._24_8_ = dStack_a80;
      local_560 = local_a98 * local_998._0_8_ + local_bf8 * dVar96 + auVar73._0_8_;
      dStack_558 = dStack_a90 * local_998._8_8_ + dStack_bf0 * dVar15 + auVar73._8_8_;
      dStack_550 = dStack_a88 * local_998._16_8_ + dStack_be8 * dVar26 + auVar73._16_8_;
      dStack_548 = dStack_a80 * local_998._24_8_ + dStack_be0 * dVar37 + auVar73._24_8_;
      auVar73 = vmulpd_avx512vl(auVar70,local_cd8);
      local_540 = local_a78 * dVar100 + local_bd8 * dVar11 + auVar73._0_8_;
      dStack_538 = dStack_a70 * dVar21 + dStack_bd0 * dVar17 + auVar73._8_8_;
      dStack_530 = dStack_a68 * dVar32 + dStack_bc8 * dVar28 + auVar73._16_8_;
      dStack_528 = dStack_a60 * dVar43 + dStack_bc0 * dVar39 + auVar73._24_8_;
      auVar73 = vmulpd_avx512vl(local_a58._64_32_,local_cb8);
      auVar63 = vmulpd_avx512vl(local_9b8,auVar69);
      auVar66._8_8_ = dVar76;
      auVar66._0_8_ = dVar75;
      auVar66._16_8_ = dVar77;
      auVar66._24_8_ = dVar78;
      local_520 = dVar75 * dVar13 + auVar63._0_8_ + auVar73._0_8_;
      dStack_518 = dVar76 * dVar24 + auVar63._8_8_ + auVar73._8_8_;
      dStack_510 = dVar77 * dVar35 + auVar63._16_8_ + auVar73._16_8_;
      dStack_508 = dVar78 * dVar46 + auVar63._24_8_ + auVar73._24_8_;
      auVar71 = vmulpd_avx512vl(auVar71,local_c98);
      local_3f8 = local_a98 * dVar99 + local_bf8 * dVar97 + auVar71._0_8_;
      dStack_3f0 = dStack_a90 * dVar20 + dStack_bf0 * dVar16 + auVar71._8_8_;
      dStack_3e8 = dStack_a88 * dVar31 + dStack_be8 * dVar27 + auVar71._16_8_;
      dStack_3e0 = dStack_a80 * dVar42 + dStack_be0 * dVar38 + auVar71._24_8_;
      auVar71 = vmulpd_avx512vl(local_8d0,local_cd8);
      auVar73 = vmulpd_avx512vl(local_870,auVar68);
      local_3d8 = local_a78 * dVar101 + auVar73._0_8_ + auVar71._0_8_;
      dStack_3d0 = dStack_a70 * dVar22 + auVar73._8_8_ + auVar71._8_8_;
      dStack_3c8 = dStack_a68 * dVar33 + auVar73._16_8_ + auVar71._16_8_;
      dStack_3c0 = dStack_a60 * dVar44 + auVar73._24_8_ + auVar71._24_8_;
      auVar71 = vmulpd_avx512vl(local_850,auVar69);
      auVar73 = vmulpd_avx512vl(local_7f0,auVar66);
      local_3b8 = auVar73._0_8_ + auVar71._0_8_ + (double)local_d98._0_8_ * local_cb8._0_8_;
      dStack_3b0 = auVar73._8_8_ + auVar71._8_8_ + (double)local_d98._8_8_ * local_cb8._8_8_;
      dStack_3a8 = auVar73._16_8_ + auVar71._16_8_ + dStack_d88 * local_cb8._16_8_;
      dStack_3a0 = auVar73._24_8_ + auVar71._24_8_ + dStack_d80 * local_cb8._24_8_;
      auVar71 = vmulpd_avx512vl(local_788,local_c98);
      auVar73 = vmulpd_avx512vl(local_728,auVar67);
      auVar63 = vmulpd_avx512vl(local_6c8,auVar55);
      local_290 = auVar63._0_8_ + auVar73._0_8_ + auVar71._0_8_;
      dStack_288 = auVar63._8_8_ + auVar73._8_8_ + auVar71._8_8_;
      dStack_280 = auVar63._16_8_ + auVar73._16_8_ + auVar71._16_8_;
      dStack_278 = auVar63._24_8_ + auVar73._24_8_ + auVar71._24_8_;
      auVar71 = vmulpd_avx512vl(auVar72,local_cd8);
      local_270 = local_a78 * dVar80 + dVar12 * local_bd8 + auVar71._0_8_;
      dStack_268 = dStack_a70 * dVar23 + dVar18 * dStack_bd0 + auVar71._8_8_;
      dStack_260 = dStack_a68 * dVar34 + dVar29 * dStack_bc8 + auVar71._16_8_;
      dStack_258 = dStack_a60 * dVar45 + dVar40 * dStack_bc0 + auVar71._24_8_;
      auVar71 = vmulpd_avx512vl(local_688,auVar66);
      local_250 = auVar71._0_8_ + dVar98 * local_bb8 + local_748 * local_cb8._0_8_;
      dStack_248 = auVar71._8_8_ + dVar19 * dStack_bb0 + dStack_740 * local_cb8._8_8_;
      dStack_240 = auVar71._16_8_ + dVar30 * dStack_ba8 + dStack_738 * local_cb8._16_8_;
      dStack_238 = auVar71._24_8_ + dVar41 * dStack_ba0 + dStack_730 * local_cb8._24_8_;
      uVar60 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      uVar7 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      _local_d98 = auVar64;
      if ((long)(uVar7 | uVar60) < 0) goto LAB_00738d90;
      if ((uVar60 == 3) && (uVar7 == 1)) {
        pauVar9 = (undefined1 (*) [16])
                  (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        auVar2._8_8_ = 0x3fe0000000000000;
        auVar2._0_8_ = 0x3fe0000000000000;
        auVar62 = vmulpd_avx512vl(*pauVar9,auVar2);
        dVar47 = *(double *)pauVar9[1] * 0.5;
        peVar5 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var6 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        dVar96 = auVar62._0_8_;
        dVar98 = (local_938 * local_938 + local_7d0 * local_7d0 + local_668 * local_668 + -1.0) *
                 dVar96;
        dVar97 = auVar62._8_8_;
        dVar99 = (dStack_930 * dStack_930 + dStack_7c8 * dStack_7c8 + dStack_660 * dStack_660 + -1.0
                 ) * dVar97;
        dVar11 = (local_928 * local_928 + local_7c0 * local_7c0 + local_658 * local_658 + -1.0) *
                 dVar47;
        dVar100 = dVar96 * (local_920 * local_920 + local_7b8 * local_7b8 + local_650 * local_650 +
                           -1.0);
        dVar101 = dVar97 * (dStack_918 * dStack_918 + dStack_7b0 * dStack_7b0 +
                            dStack_648 * dStack_648 + -1.0);
        dVar12 = dVar47 * (local_910 * local_910 + local_7a8 * local_7a8 + local_640 * local_640 +
                          -1.0);
        dVar96 = dVar96 * (local_908 * local_908 + local_7a0 * local_7a0 + local_638 * local_638 +
                          -1.0);
        dVar97 = dVar97 * (dStack_900 * dStack_900 + dStack_798 * dStack_798 +
                           dStack_630 * dStack_630 + -1.0);
        dVar47 = dVar47 * (local_8f8 * local_8f8 + local_790 * local_790 + local_628 * local_628 +
                          -1.0);
        auVar62 = *(undefined1 (*) [16])
                   (peVar5->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                   m_storage.m_data.array;
        auVar4 = *(undefined1 (*) [16])
                  ((long)(peVar5->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                         .m_storage.m_data.array + 0x10);
        auVar2 = *(undefined1 (*) [16])
                  ((long)(peVar5->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                         .m_storage.m_data.array + 0x20);
        auVar3 = *(undefined1 (*) [16])
                  ((long)(peVar5->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                         .m_storage.m_data.array + 0x30);
        dVar10 = *(double *)
                  ((long)(peVar5->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                         .m_storage.m_data.array + 0x40);
        local_e28 = auVar62._0_8_;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        auVar48 = vshufpd_avx(auVar62,auVar62,1);
        auVar62 = vshufpd_avx(auVar62,auVar62,3);
        dVar80 = auVar4._0_8_;
        local_230 = dVar98 * local_e28 + dVar100 * auVar62._0_8_ + dVar96 * dVar80;
        dStack_228 = dVar99 * local_e28 + dVar101 * auVar62._8_8_ + dVar97 * dVar80;
        local_220 = dVar11 * local_e28 + dVar12 * auVar48._0_8_ + dVar47 * dVar80;
        auVar62 = vshufpd_avx(auVar4,auVar4,1);
        auVar48 = vshufpd_avx(auVar2,auVar2,1);
        auVar4 = vshufpd_avx(auVar4,auVar4,3);
        dVar80 = auVar2._0_8_;
        auVar2 = vshufpd_avx(auVar2,auVar2,3);
        local_218 = dVar96 * auVar2._0_8_ + dVar98 * auVar4._0_8_ + dVar100 * dVar80;
        dStack_210 = dVar97 * auVar2._8_8_ + dVar99 * auVar4._8_8_ + dVar101 * dVar80;
        local_208 = dVar47 * auVar48._0_8_ + dVar11 * auVar62._0_8_ + dVar12 * dVar80;
        auVar62 = vshufpd_avx(auVar3,auVar3,1);
        dVar80 = auVar3._0_8_;
        auVar4 = vshufpd_avx(auVar3,auVar3,3);
        local_200 = dVar98 * dVar80 + dVar100 * auVar4._0_8_ + dVar96 * dVar10;
        dStack_1f8 = dVar99 * dVar80 + dVar101 * auVar4._8_8_ + dVar97 * dVar10;
        local_1f0 = dVar10 * dVar47 + dVar11 * dVar80 + dVar12 * auVar62._0_8_;
        local_500 = local_230 * local_938;
        dStack_4f8 = dStack_228 * dStack_930;
        local_4f0 = local_220 * local_928;
        local_398 = local_230 * local_7d0;
        dStack_390 = dStack_228 * dStack_7c8;
        local_388 = local_220 * local_7c0;
        local_230 = local_230 * local_668;
        dStack_228 = dStack_228 * dStack_660;
        local_220 = local_220 * local_658;
        local_4e8 = local_218 * local_920;
        dStack_4e0 = dStack_210 * dStack_918;
        local_4d8 = local_208 * local_910;
        local_380 = local_218 * local_7b8;
        dStack_378 = dStack_210 * dStack_7b0;
        local_370 = local_208 * local_7a8;
        local_218 = local_218 * local_650;
        dStack_210 = dStack_210 * dStack_648;
        local_208 = local_208 * local_640;
        local_4d0 = local_200 * local_908;
        dStack_4c8 = dStack_1f8 * dStack_900;
        local_4c0 = local_1f0 * local_8f8;
        local_368 = local_200 * local_7a0;
        dStack_360 = dStack_1f8 * dStack_798;
        local_358 = local_1f0 * local_790;
        local_200 = local_200 * local_638;
        dStack_1f8 = dStack_1f8 * dStack_630;
        local_1f0 = local_1f0 * local_628;
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols != 0x2d) {
          pcVar59 = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 45, 3, 0>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 45, 3, 0>, Option = 0]"
          ;
          goto LAB_00738e2e;
        }
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows == 9) {
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x18] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x19] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x1a] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x10] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x11] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x12] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x13] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x14] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x15] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x16] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x17] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[8] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[9] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[10] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xb] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xc] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xd] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xe] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xf] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[1] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[2] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[3] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[4] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[5] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[6] = 0.0;
          local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[7] = 0.0;
          local_e00 = 1.0;
          Eigen::internal::
          generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,45,3,0,45,3>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::scaleAndAddTo<Eigen::Matrix<double,9,3,1,9,3>>
                    (&local_1e8,&this->m_SD,(Matrix<double,_45,_3,_0,_45,_3> *)local_620,&local_e00)
          ;
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              != 0x1b) {
            pdVar58 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data;
            if (pdVar58 != (double *)0x0) {
              free((void *)pdVar58[-1]);
            }
            pvVar56 = malloc(0x118);
            if (pvVar56 == (void *)0x0) {
              pdVar58 = (double *)0x0;
            }
            else {
              *(void **)(((ulong)pvVar56 & 0xffffffffffffffc0) + 0x38) = pvVar56;
              pdVar58 = (double *)(((ulong)pvVar56 & 0xffffffffffffffc0) + 0x40);
            }
            if (pdVar58 == (double *)0x0) {
              puVar57 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar57 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar57,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
                 pdVar58;
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
                 0x1b;
          }
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              == 0x1b) {
            pdVar58 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data;
            uVar60 = 0xfffffffffffffff8;
            do {
              dVar47 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                       m_storage.m_data.array[uVar60 + 9];
              dVar10 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                       m_storage.m_data.array[uVar60 + 10];
              dVar96 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                       m_storage.m_data.array[uVar60 + 0xb];
              dVar97 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                       m_storage.m_data.array[uVar60 + 0xc];
              dVar11 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                       m_storage.m_data.array[uVar60 + 0xd];
              dVar12 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                       m_storage.m_data.array[uVar60 + 0xe];
              dVar98 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                       m_storage.m_data.array[uVar60 + 0xf];
              pdVar1 = pdVar58 + uVar60 + 8;
              *pdVar1 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                        m_storage.m_data.array[uVar60 + 8];
              pdVar1[1] = dVar47;
              pdVar1[2] = dVar10;
              pdVar1[3] = dVar96;
              pdVar1[4] = dVar97;
              pdVar1[5] = dVar11;
              pdVar1[6] = dVar12;
              pdVar1[7] = dVar98;
              uVar60 = uVar60 + 8;
            } while (uVar60 < 0x10);
            lVar61 = 0x18;
            do {
              pdVar58[lVar61] =
                   local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
                   m_data.array[lVar61];
              lVar61 = lVar61 + 1;
            } while (lVar61 != 0x1b);
            return;
          }
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 27, 1>>, T1 = double, T2 = double]"
                       );
        }
        pcVar59 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 3, 1>]"
        ;
        goto LAB_00738e50;
      }
      pcVar59 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 3, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    else {
      pcVar59 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 12, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar59);
  }
LAB_00738d90:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, -1>]"
               );
}

Assistant:

void ChElementBeamANCF_3333::ComputeInternalForcesContIntNoDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear material model (no damping).  For this style of method, the generalized internal force vector is
    // integrated across the volume of the element every time this calculation is performed. For this element, this is
    // likely more efficient than the "Pre-Integration" style calculation method.  Note that the integrand for the
    // generalize internal force vector for a straight and normalized element is of order : 8 in xi, 4 in eta, and 4 in
    // zeta. This requires GQ 5 points along the xi direction and 3 GQ points along the eta and zeta directions for
    // "Full Integration". However, very similar results can be obtained with fewer GQ point in each direction,
    // resulting in significantly fewer calculations.  Based on testing, this could be as low as 3x2x2

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // =============================================================================
    // Calculate the deformation gradient for all Gauss quadrature points in a single matrix multiplication.  Note
    // that since the shape function derivative matrix is ordered by columns, the resulting deformation gradient
    // will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31 ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32 ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33 ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31 ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32 ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33 ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FC = m_SD.transpose() * e_bar.transpose();

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, first calculate the contribution to
    // the generalized internal force vector from the terms that do not include the Poisson effect.  This is integrated
    // across the entire volume of the element using the full number of Gauss quadrature points.
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (does not include the Poisson effect)
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) for efficiency. Since only the diagonal terms in the 6x6 stiffness matrix are
    // used, the 2nd Piola-Kirchoff stress can be calculated by simply scaling the vector of scaled Green-Lagrange
    // strains in Voight notation by the corresponding diagonal entry in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*E11 = D11*kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0.array() *= (0.5 * D0(0)) * m_kGQ_D0.array();

    // Each entry in SPK2_2 = D22*kGQ*E22 = D22*kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0.array() *= (0.5 * D0(1)) * m_kGQ_D0.array();

    // Each entry in SPK2_3 = D33*kGQ_D0*E33 = D33*kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0.array() *= (0.5 * D0(2)) * m_kGQ_D0.array();

    // Each entry in SPK2_4 = D44*kGQ*2*E23 = D44*kGQ*(F12*F13+F22*F23+F32*F33)
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0.array() *= D0(3) * m_kGQ_D0.array();

    // Each entry in SPK2_5 = D55*kGQ*2*E13 = D55*kGQ*(F11*F13+F21*F23+F31*F33)
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0.array() *= D0(4) * m_kGQ_D0.array();

    // Each entry in SPK2_6 = D66*kGQ*2*E12 = D66*(F11*F12+F21*F22+F31*F32)
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0.array() *= D0(5) * m_kGQ_D0.array();

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the Dv Blocks entries are calculated in a later step
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP_D0, 1>(0, 0) = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 1) = FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 2) = FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_5_Block_D0);

    P_Block.template block<NIP_D0, 1>(NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0);

    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_3_Block_D0);

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, second calculate the contribution to
    // the generalized internal force vector from the terms that include the Poisson effect.  This is integrated
    // across the entire volume of the element using Gauss quadrature points only along the beam axis.  It is assumed
    // that an isotropic material or orthotropic material aligned with its principle axes is used
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The combined result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) again for efficiency. Results are written in Voigt notation: epsilon =
    // [E11,E22,E33,2*E23,2*E13,2*E12] Note that with the material assumption being used, only [E11,E22,E33] need to be
    // calculated
    // =============================================================================

    // Each entry in E1 = kGQ*E11 = kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*E22 = kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*E33 = kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have already been scaled
    // by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point to make the
    // calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the D0 entries have already been calculated above
    // =============================================================================

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(SPK2_1_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).cwiseProduct(SPK2_2_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).cwiseProduct(SPK2_3_Block_Dv);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}